

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_compact.hpp
# Opt level: O1

void __thiscall Catch::CompactReporter::AssertionPrinter::printSourceInfo(AssertionPrinter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *os;
  AssertionResult *pAVar2;
  pointer pcVar3;
  SourceLineInfo local_50;
  undefined1 local_21;
  Colour colourGuard;
  
  local_21 = 0;
  Colour::use(FileName);
  os = this->stream;
  pAVar2 = this->result;
  paVar1 = &local_50.file.field_2;
  pcVar3 = (pAVar2->m_info).lineInfo.file._M_dataplus._M_p;
  local_50.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + (pAVar2->m_info).lineInfo.file._M_string_length);
  local_50.line = (pAVar2->m_info).lineInfo.line;
  operator<<(os,&local_50);
  std::__ostream_insert<char,std::char_traits<char>>(os,":",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.file._M_dataplus._M_p,local_50.file.field_2._M_allocated_capacity + 1);
  }
  Colour::use(None);
  return;
}

Assistant:

void printSourceInfo() const {
                Colour colourGuard( Colour::FileName );
                stream << result.getSourceInfo() << ":";
            }